

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

void Abc_NtkFraigTrustOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  Vec_Ptr_t *p;
  ProgressBar *p_00;
  Abc_Obj_t *pAVar2;
  int local_44;
  Abc_Obj_t *pAStack_40;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkDfs(pNtk,0);
  p_00 = Extra_ProgressBarStart(_stdout,p->nSize);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p);
    if (iVar1 <= local_44) {
      Vec_PtrFree(p);
      Extra_ProgressBarStop(p_00);
      return;
    }
    pAStack_40 = (Abc_Obj_t *)Vec_PtrEntry(p,local_44);
    Extra_ProgressBarUpdate(p_00,local_44,(char *)0x0);
    iVar1 = Abc_ObjIsNode(pAStack_40);
    if (iVar1 == 0) break;
    pAVar2 = Abc_NodeFraigTrust(pNtkNew,pAStack_40);
    iVar1 = Abc_NtkIsNetlist(pNtk);
    if (iVar1 != 0) {
      pAStack_40 = Abc_ObjFanout0(pAStack_40);
    }
    if ((pAStack_40->field_6).pTemp != (void *)0x0) {
      __assert_fail("pObj->pCopy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                    ,0x246,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    (pAStack_40->field_6).pCopy = pAVar2;
    local_44 = local_44 + 1;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                ,0x23d,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFraigTrustOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pNodeNew, * pObj;
    int i;

    // perform strashing
    vNodes = Abc_NtkDfs( pNtk, 0 );
    pProgress = Extra_ProgressBarStart( stdout, vNodes->nSize );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // get the node
        assert( Abc_ObjIsNode(pNode) );
         // strash the node
        pNodeNew = Abc_NodeFraigTrust( pNtkNew, pNode );
        // get the old object
        if ( Abc_NtkIsNetlist(pNtk) )
            pObj = Abc_ObjFanout0( pNode ); // the fanout net 
        else 
            pObj = pNode; // the node itself
        // make sure the node is not yet strashed
        assert( pObj->pCopy == NULL );
        // mark the old object with the new AIG node
        pObj->pCopy = pNodeNew;
    }
    Vec_PtrFree( vNodes );
    Extra_ProgressBarStop( pProgress );
}